

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_protocol_handle_send_unreliable
              (ENetHost *host,ENetPeer *peer,ENetProtocol *command,enet_uint8 **currentData)

{
  uint16_t uVar1;
  ENetIncomingCommand *pEVar2;
  ulong *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t dataLength;
  undefined4 local_4;
  
  if (((ulong)*(byte *)(in_RDX + 1) < *(ulong *)(in_RSI + 0x48)) &&
     ((*(int *)(in_RSI + 0x38) == 5 || (*(int *)(in_RSI + 0x38) == 6)))) {
    uVar1 = ntohs(*(uint16_t *)(in_RDX + 6));
    *in_RCX = (ulong)uVar1 + *in_RCX;
    if ((*(ulong *)(in_RDI + 0x2b40) < (ulong)uVar1) ||
       ((*in_RCX < *(ulong *)(in_RDI + 0x2b00) ||
        ((ulong)(*(long *)(in_RDI + 0x2b00) + *(long *)(in_RDI + 0x2b08)) < *in_RCX)))) {
      local_4 = -1;
    }
    else {
      pEVar2 = enet_peer_queue_incoming_command
                         ((ENetPeer *)host,(ENetProtocol *)peer,command,(size_t)currentData,
                          dataLength._4_4_,(enet_uint32)dataLength);
      if (pEVar2 == (ENetIncomingCommand *)0x0) {
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
enet_protocol_handle_send_unreliable (ENetHost * host, ENetPeer * peer, const ENetProtocol * command, enet_uint8 ** currentData)
{
    size_t dataLength;

    if (command -> header.channelID >= peer -> channelCount ||
        (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER))
      return -1;

    dataLength = ENET_NET_TO_HOST_16 (command -> sendUnreliable.dataLength);
    * currentData += dataLength;
    if (dataLength > host -> maximumPacketSize ||
        * currentData < host -> receivedData ||
        * currentData > & host -> receivedData [host -> receivedDataLength])
      return -1;

    if (enet_peer_queue_incoming_command (peer, command, (const enet_uint8 *) command + sizeof (ENetProtocolSendUnreliable), dataLength, 0, 0) == NULL)
      return -1;

    return 0;
}